

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessauthenticationmanager.cpp
# Opt level: O3

QByteArray * authenticationKey(QByteArray *__return_storage_ptr__,QUrl *url,QString *realm)

{
  long in_FS_OFFSET;
  QUrl copy;
  QArrayData *local_68;
  char *pcStack_60;
  qsizetype local_58;
  QStringBuilder<const_char_(&)[6],_QByteArray> local_48;
  QUrl local_28;
  QByteArray *local_20;
  
  local_20 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  local_28.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_28,url);
  QUrl::setFragment((QString *)&local_28,(ParsingMode)realm);
  QUrl::toEncoded(&local_68,&local_28,0x62);
  local_48.b.d.size = local_58;
  local_48.b.d.ptr = pcStack_60;
  local_48.b.d.d = (Data *)local_68;
  local_48.a = (char (*) [6])0x258b2e;
  local_68 = (QArrayData *)0x0;
  pcStack_60 = (char *)0x0;
  local_58 = 0;
  QStringBuilder<const_char_(&)[6],_QByteArray>::convertTo<QByteArray>
            (__return_storage_ptr__,&local_48);
  if (&(local_48.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.b.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  QUrl::~QUrl(&local_28);
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(QByteArray **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static inline QByteArray authenticationKey(const QUrl &url, const QString &realm)
{
    QUrl copy = url;
    copy.setFragment(realm);
    return "auth:" + copy.toEncoded(QUrl::RemovePassword | QUrl::RemovePath | QUrl::RemoveQuery);
}